

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCAutoArray * NULLC::AutoArrayAssign(NULLCAutoArray *left,NULLCRef right)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  NULLCArray *arr;
  NULLCAutoArray *left_local;
  
  if (left == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    left_local = (NULLCAutoArray *)0x0;
  }
  else {
    left_local = left;
    if (right.typeID == 0xf) {
      *(undefined8 *)left = *(undefined8 *)right.ptr;
      *(undefined8 *)((long)&left->ptr + 4) = *(undefined8 *)(right.ptr + 8);
    }
    else {
      iVar1 = nullcIsArray(right.typeID);
      if (iVar1 == 0) {
        pcVar3 = nullcGetTypeName(right.typeID);
        nullcThrowError("ERROR: cannot convert from \'%s\' to \'auto[]\'",pcVar3);
        left_local = (NULLCAutoArray *)0x0;
      }
      else {
        uVar2 = nullcGetArraySize(right.typeID);
        left->len = uVar2;
        if (left->len == 0xffffffff) {
          left->len = *(uint *)(right.ptr + 8);
          left->ptr = *(char **)right.ptr;
        }
        else {
          left->ptr = right.ptr;
        }
        uVar2 = nullcGetSubType(right.typeID);
        left->typeID = uVar2;
      }
    }
  }
  return left_local;
}

Assistant:

NULLCAutoArray* NULLC::AutoArrayAssign(NULLCAutoArray* left, NULLCRef right)
{
	if(!left)
	{
		nullcThrowError("ERROR: null pointer access");
		return 0;
	}
	if(right.typeID == NULLC_TYPE_AUTO_ARRAY)
	{
		*left = *(NULLCAutoArray*)right.ptr;
		return left;
	}
	if(!nullcIsArray(right.typeID))
	{
		nullcThrowError("ERROR: cannot convert from '%s' to 'auto[]'", nullcGetTypeName(right.typeID));
		return 0;
	}

	left->len = nullcGetArraySize(right.typeID);
	if(left->len == ~0u)
	{
		NULLCArray *arr = (NULLCArray*)right.ptr;
		left->len = arr->len;
		left->ptr = arr->ptr;
	}else{
		left->ptr = right.ptr;
	}
	left->typeID = nullcGetSubType(right.typeID);

	return left;
}